

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void QUnifiedTimer::startAnimationTimer(QAbstractAnimationTimer *timer)

{
  QUnifiedTimer *obj;
  long in_FS_OFFSET;
  QAbstractAnimationTimer *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (timer->isRegistered == false) {
    timer->isRegistered = true;
    obj = instance(true);
    local_38 = timer;
    QtPrivate::QPodArrayOps<QAbstractAnimationTimer*>::emplace<QAbstractAnimationTimer*&>
              ((QPodArrayOps<QAbstractAnimationTimer*> *)&obj->animationTimersToStart,
               (obj->animationTimersToStart).d.size,&local_38);
    QList<QAbstractAnimationTimer_*>::end(&obj->animationTimersToStart);
    if (obj->startTimersPending == false) {
      obj->startTimersPending = true;
      local_38 = (QAbstractAnimationTimer *)0x0;
      pcStack_30 = (char *)0x0;
      local_28 = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (&obj->super_QObject,"startTimers",QueuedConnection,1,&local_38,&pcStack_30,
                 &local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::startAnimationTimer(QAbstractAnimationTimer *timer)
{
    if (timer->isRegistered)
        return;
    timer->isRegistered = true;

    QUnifiedTimer *inst = instance(true); //we create the instance if needed
    inst->animationTimersToStart << timer;
    if (!inst->startTimersPending) {
        inst->startTimersPending = true;
        QMetaObject::invokeMethod(inst, "startTimers", Qt::QueuedConnection);
    }
}